

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlCompileShader(char *shaderCode,int type)

{
  GLint GVar1;
  GLuint GVar2;
  GLchar *__ptr;
  char *pcVar3;
  int length;
  int maxLength;
  GLint success;
  GLsizei local_3c;
  GLint local_38;
  GLint local_34;
  char *local_30;
  
  local_30 = shaderCode;
  GVar2 = (*glad_glCreateShader)(type);
  (*glad_glShaderSource)(GVar2,1,&local_30,(GLint *)0x0);
  local_34 = 0;
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&local_34);
  if (local_34 != 0) {
    if (type == 0x8b30) {
      pcVar3 = "SHADER: [ID %i] Fragment shader compiled successfully";
    }
    else {
      if (type != 0x8b31) {
        return GVar2;
      }
      pcVar3 = "SHADER: [ID %i] Vertex shader compiled successfully";
    }
    TraceLog(3,pcVar3,(ulong)GVar2);
    return GVar2;
  }
  if (type == 0x8b31) {
    pcVar3 = "SHADER: [ID %i] Failed to compile vertex shader code";
  }
  else {
    if (type != 0x8b30) goto LAB_0011c653;
    pcVar3 = "SHADER: [ID %i] Failed to compile fragment shader code";
  }
  TraceLog(4,pcVar3,(ulong)GVar2);
LAB_0011c653:
  local_38 = 0;
  (*glad_glGetShaderiv)(GVar2,0x8b84,&local_38);
  GVar1 = local_38;
  if (0 < (long)local_38) {
    local_3c = 0;
    __ptr = (GLchar *)calloc((long)local_38,1);
    (*glad_glGetShaderInfoLog)(GVar2,GVar1,&local_3c,__ptr);
    TraceLog(4,"SHADER: [ID %i] Compile error: %s",(ulong)GVar2,__ptr);
    free(__ptr);
  }
  return GVar2;
}

Assistant:

unsigned int rlCompileShader(const char *shaderCode, int type)
{
    unsigned int shader = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    shader = glCreateShader(type);
    glShaderSource(shader, 1, &shaderCode, NULL);

    GLint success = 0;
    glCompileShader(shader);
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);

    if (success == GL_FALSE)
    {
        switch (type)
        {
            case GL_VERTEX_SHADER: TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to compile vertex shader code", shader); break;
            case GL_FRAGMENT_SHADER: TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to compile fragment shader code", shader); break;
            //case GL_GEOMETRY_SHADER:
            //case GL_COMPUTE_SHADER:
            default: break;
        }

        int maxLength = 0;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &maxLength);

        if (maxLength > 0)
        {
            int length = 0;
            char *log = RL_CALLOC(maxLength, sizeof(char));
            glGetShaderInfoLog(shader, maxLength, &length, log);
            TRACELOG(LOG_WARNING, "SHADER: [ID %i] Compile error: %s", shader, log);
            RL_FREE(log);
        }
    }
    else
    {
        switch (type)
        {
            case GL_VERTEX_SHADER: TRACELOG(LOG_INFO, "SHADER: [ID %i] Vertex shader compiled successfully", shader); break;
            case GL_FRAGMENT_SHADER: TRACELOG(LOG_INFO, "SHADER: [ID %i] Fragment shader compiled successfully", shader); break;
            //case GL_GEOMETRY_SHADER:
            //case GL_COMPUTE_SHADER:
            default: break;
        }
    }
#endif

    return shader;
}